

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Cone(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Vec_t *p;
  bool bVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  char *pcVar7;
  bool bVar8;
  Vec_Vec_t *vClasses;
  Vec_Int_t *vClass;
  Gia_Man_t *pOne;
  int nDigits;
  int i;
  Gia_Obj_t *pObj;
  char Buffer [1000];
  int fVerbose;
  int fExtractAll;
  int fUseAllCis;
  int nTimeWindow;
  int nLevelMax;
  int iPartNum;
  int nOutRange;
  int iOutNum;
  int c;
  Vec_Int_t *vPos;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  iPartNum = -1;
  nLevelMax = 1;
  nTimeWindow = -1;
  fUseAllCis = 0;
  fExtractAll = 0;
  bVar1 = false;
  bVar8 = false;
  Buffer[0x3e4] = '\0';
  Buffer[0x3e5] = '\0';
  Buffer[0x3e6] = '\0';
  Buffer[999] = '\0';
  Extra_UtilGetoptReset();
LAB_002ba6a5:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"ORPLWaevh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Cone(): There is no AIG.\n");
        return 1;
      }
      if (bVar8) {
        uVar3 = Gia_ManPoNum(pAbc->pGia);
        uVar3 = Abc_Base10Log(uVar3);
        pOne._4_4_ = 0;
        while( true ) {
          iVar2 = Gia_ManPoNum(pAbc->pGia);
          bVar8 = false;
          if (pOne._4_4_ < iVar2) {
            _nDigits = Gia_ManCo(pAbc->pGia,pOne._4_4_);
            bVar8 = _nDigits != (Gia_Obj_t *)0x0;
          }
          if (!bVar8) break;
          pGVar4 = Gia_ManDupDfsCone(pAbc->pGia,_nDigits);
          pcVar7 = Extra_FileNameGeneric(pAbc->pGia->pSpec);
          sprintf((char *)&pObj,"%s_%0*d.aig",pcVar7,(ulong)uVar3);
          Gia_AigerWrite(pGVar4,(char *)&pObj,0,0,0);
          Gia_ManStop(pGVar4);
          pOne._4_4_ = pOne._4_4_ + 1;
        }
        printf("Dumped all outputs into individual AIGER files.\n");
        return 0;
      }
      if ((fUseAllCis != 0) || (fExtractAll != 0)) {
        if ((fUseAllCis != 0) && (fExtractAll != 0)) {
          Abc_Print(-1,
                    "Abc_CommandAbc9Cone(): Parameters -L (max level) and -W (timing window) cannot be specified at the same time.\n"
                   );
          return 1;
        }
        pGVar4 = Gia_ManExtractWindow(pAbc->pGia,fUseAllCis,fExtractAll,Buffer._996_4_);
        Abc_FrameUpdateGia(pAbc,pGVar4);
        return 0;
      }
      if (nTimeWindow < 0) {
        if ((-1 < iPartNum) && (iVar2 = Gia_ManPoNum(pAbc->pGia), iPartNum + nLevelMax <= iVar2)) {
          pVVar5 = Vec_IntStartRange(iPartNum,nLevelMax);
          pGVar4 = pAbc->pGia;
          piVar6 = Vec_IntArray(pVVar5);
          pGVar4 = Gia_ManDupCones(pGVar4,piVar6,nLevelMax,(uint)((bVar1 ^ 0xffU) & 1));
          Vec_IntFree(pVVar5);
          if (pGVar4 != (Gia_Man_t *)0x0) {
            Abc_FrameUpdateGia(pAbc,pGVar4);
          }
          return 0;
        }
        Abc_Print(-1,"Abc_CommandAbc9Cone(): Range of outputs to extract is incorrect.\n");
        return 1;
      }
      p = (Vec_Vec_t *)pAbc->vPoEquivs;
      if (p == (Vec_Vec_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Cone(): Partitions are not defined.\n");
        return 1;
      }
      iVar2 = Vec_VecSize(p);
      if (iVar2 <= nTimeWindow) {
        Abc_Print(-1,"Abc_CommandAbc9Cone(): Partition index exceed the array size.\n");
        return 1;
      }
      pVVar5 = Vec_VecEntryInt(p,nTimeWindow);
      pGVar4 = pAbc->pGia;
      piVar6 = Vec_IntArray(pVVar5);
      iVar2 = Vec_IntSize(pVVar5);
      pGVar4 = Gia_ManDupCones(pGVar4,piVar6,iVar2,(uint)((bVar1 ^ 0xffU) & 1));
      if (pGVar4 != (Gia_Man_t *)0x0) {
        Abc_FrameUpdateGia(pAbc,pGVar4);
      }
      return 0;
    }
    switch(iVar2) {
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_002bacdf;
      }
      fUseAllCis = atoi(argv[globalUtilOptind]);
      iVar2 = fUseAllCis;
      break;
    default:
      goto LAB_002bacdf;
    case 0x4f:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
        goto LAB_002bacdf;
      }
      iPartNum = atoi(argv[globalUtilOptind]);
      iVar2 = iPartNum;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002bacdf;
      }
      nTimeWindow = atoi(argv[globalUtilOptind]);
      iVar2 = nTimeWindow;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_002bacdf;
      }
      nLevelMax = atoi(argv[globalUtilOptind]);
      iVar2 = nLevelMax;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_002bacdf;
      }
      fExtractAll = atoi(argv[globalUtilOptind]);
      iVar2 = fExtractAll;
      break;
    case 0x61:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002ba6a5;
    case 0x65:
      bVar8 = (bool)(bVar8 ^ 1);
      goto LAB_002ba6a5;
    case 0x68:
      goto LAB_002bacdf;
    case 0x76:
      Buffer._996_4_ = Buffer._996_4_ ^ 1;
      goto LAB_002ba6a5;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_002bacdf:
      Abc_Print(-2,"usage: &cone [-ORPLW num] [-aevh]\n");
      Abc_Print(-2,"\t         extracting multi-output sequential logic cones\n");
      Abc_Print(-2,"\t-O num : the index of first PO to extract [default = %d]\n",
                (ulong)(uint)iPartNum);
      Abc_Print(-2,"\t-R num : (optional) the number of outputs to extract [default = %d]\n",
                (ulong)(uint)nLevelMax);
      Abc_Print(-2,"\t-P num : (optional) the partition number to extract [default = %d]\n",
                (ulong)(uint)nTimeWindow);
      Abc_Print(-2,"\t-L num : (optional) extract cones with higher level [default = %d]\n",
                (ulong)(uint)fUseAllCis);
      Abc_Print(-2,"\t-W num : (optional) extract cones falling into this window [default = %d]\n",
                (ulong)(uint)fExtractAll);
      pcVar7 = "structural";
      if (bVar1) {
        pcVar7 = "all";
      }
      Abc_Print(-2,"\t-a     : toggle keeping all CIs or structral support only [default = %s]\n",
                pcVar7);
      pcVar7 = "no";
      if (bVar8) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-e     : toggle writing all outputs into individual files [default = %s]\n",
                pcVar7);
      pcVar7 = "no";
      if (Buffer._996_4_ != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Cone( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    Vec_Int_t * vPos;
    int c, iOutNum = -1, nOutRange = 1, iPartNum = -1, nLevelMax = 0, nTimeWindow = 0, fUseAllCis = 0, fExtractAll = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORPLWaevh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutNum < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutRange < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            iPartNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iPartNum < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelMax < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeWindow = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeWindow < 0 )
                goto usage;
            break;
        case 'a':
            fUseAllCis ^= 1;
            break;
        case 'e':
            fExtractAll ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cone(): There is no AIG.\n" );
        return 1;
    }
    if ( fExtractAll )
    {
        char Buffer[1000];
        Gia_Obj_t * pObj;
        int i, nDigits = Abc_Base10Log(Gia_ManPoNum(pAbc->pGia));
        Gia_ManForEachPo( pAbc->pGia, pObj, i )
        {
            Gia_Man_t * pOne = Gia_ManDupDfsCone( pAbc->pGia, pObj );
            sprintf( Buffer, "%s_%0*d.aig", Extra_FileNameGeneric(pAbc->pGia->pSpec), nDigits, i );
            Gia_AigerWrite( pOne, Buffer, 0, 0, 0 );
            Gia_ManStop( pOne );
        }
        printf( "Dumped all outputs into individual AIGER files.\n" );
        return 0;
    }
    if ( nLevelMax || nTimeWindow )
    {
        if ( nLevelMax && nTimeWindow )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Parameters -L (max level) and -W (timing window) cannot be specified at the same time.\n" );
            return 1;
        }
        else
        {
            pTemp = Gia_ManExtractWindow( pAbc->pGia, nLevelMax, nTimeWindow, fVerbose );
            Abc_FrameUpdateGia( pAbc, pTemp );
            return 0;
        }
    }
    if ( iPartNum >= 0 )
    {
        Vec_Int_t * vClass;
        Vec_Vec_t * vClasses = (Vec_Vec_t *)pAbc->vPoEquivs;
        if ( vClasses == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Partitions are not defined.\n" );
            return 1;
        }
        if ( iPartNum >= Vec_VecSize(vClasses) )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Partition index exceed the array size.\n" );
            return 1;
        }
        vClass = Vec_VecEntryInt( vClasses, iPartNum );
        pTemp = Gia_ManDupCones( pAbc->pGia, Vec_IntArray(vClass), Vec_IntSize(vClass), !fUseAllCis );
        if ( pTemp )
            Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( iOutNum < 0 || iOutNum + nOutRange > Gia_ManPoNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cone(): Range of outputs to extract is incorrect.\n" );
        return 1;
    }
    vPos = Vec_IntStartRange( iOutNum, nOutRange );
    pTemp = Gia_ManDupCones( pAbc->pGia, Vec_IntArray(vPos), nOutRange, !fUseAllCis );
    Vec_IntFree( vPos );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &cone [-ORPLW num] [-aevh]\n" );
    Abc_Print( -2, "\t         extracting multi-output sequential logic cones\n" );
    Abc_Print( -2, "\t-O num : the index of first PO to extract [default = %d]\n", iOutNum );
    Abc_Print( -2, "\t-R num : (optional) the number of outputs to extract [default = %d]\n", nOutRange );
    Abc_Print( -2, "\t-P num : (optional) the partition number to extract [default = %d]\n", iPartNum );
    Abc_Print( -2, "\t-L num : (optional) extract cones with higher level [default = %d]\n", nLevelMax );
    Abc_Print( -2, "\t-W num : (optional) extract cones falling into this window [default = %d]\n", nTimeWindow );
    Abc_Print( -2, "\t-a     : toggle keeping all CIs or structral support only [default = %s]\n", fUseAllCis? "all": "structural" );
    Abc_Print( -2, "\t-e     : toggle writing all outputs into individual files [default = %s]\n", fExtractAll? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}